

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

string * __thiscall leveldb::InternalKey::DebugString_abi_cxx11_(InternalKey *this)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  ParsedInternalKey parsed;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  string *in_stack_fffffffffffffdd0;
  ParsedInternalKey *in_stack_fffffffffffffdd8;
  Slice *this_00;
  Slice *in_stack_fffffffffffffde0;
  ParsedInternalKey *in_stack_fffffffffffffe28;
  string local_1a0 [32];
  Slice local_180 [23];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)in_stack_fffffffffffffdc8);
  Slice::Slice(&in_stack_fffffffffffffdd8->user_key,in_stack_fffffffffffffdd0);
  bVar1 = ParseInternalKey(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  if (bVar1) {
    ParsedInternalKey::DebugString_abi_cxx11_(in_stack_fffffffffffffe28);
  }
  else {
    this_00 = local_180;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    poVar2 = std::operator<<((ostream *)this_00,"(bad)");
    Slice::Slice(this_00,in_stack_fffffffffffffdd0);
    EscapeString_abi_cxx11_((Slice *)in_RDI);
    std::operator<<(poVar2,local_1a0);
    std::__cxx11::string::~string(in_stack_fffffffffffffdc8);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string InternalKey::DebugString() const {
  ParsedInternalKey parsed;
  if (ParseInternalKey(rep_, &parsed)) {
    return parsed.DebugString();
  }
  std::ostringstream ss;
  ss << "(bad)" << EscapeString(rep_);
  return ss.str();
}